

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_d.h
# Opt level: O0

void __thiscall draco::VectorD<float,_3>::Normalize(VectorD<float,_3> *this)

{
  Scalar *pSVar1;
  Scalar SVar2;
  float fVar3;
  undefined4 extraout_XMM0_Db;
  double dVar4;
  int i;
  Scalar magnitude;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  float fVar5;
  undefined4 local_10;
  
  SVar2 = SquaredNorm((VectorD<float,_3> *)0x14f9a8);
  dVar4 = std::sqrt((double)CONCAT44(extraout_XMM0_Db,SVar2));
  fVar3 = SUB84(dVar4,0);
  if ((fVar3 != 0.0) || (NAN(fVar3))) {
    for (local_10 = 0; local_10 < 3; local_10 = local_10 + 1) {
      fVar5 = fVar3;
      pSVar1 = operator[]((VectorD<float,_3> *)CONCAT44(fVar3,in_stack_ffffffffffffffe0),
                          in_stack_ffffffffffffffdc);
      *pSVar1 = *pSVar1 / fVar5;
    }
  }
  return;
}

Assistant:

void Normalize() {
    const Scalar magnitude = std::sqrt(this->SquaredNorm());
    if (magnitude == 0) {
      return;
    }
    for (int i = 0; i < dimension; ++i) {
      (*this)[i] /= magnitude;
    }
  }